

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<basisu::image_stats>::~vector(vector<basisu::image_stats> *this)

{
  image_stats *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)&in_RDI->m_filename != 0) {
    scalar_type<basisu::image_stats>::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)&in_RDI->m_filename);
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }